

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void pbrt::createCamera(SP *scene,SP *pbrt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined4 uVar10;
  element_type *peVar11;
  pointer psVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar14;
  runtime_error *this_00;
  pointer psVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  SP ours;
  undefined1 local_d9;
  value_type local_d8;
  SP local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Camera *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Camera,std::allocator<pbrt::Camera>>
            (&local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Camera **)&local_d8,(allocator<pbrt::Camera> *)&local_d9);
  std::__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Camera,pbrt::Camera>
            ((__shared_ptr<pbrt::Camera,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar11 = (pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar15 = (peVar11->cameras).
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar12 = (peVar11->cameras).
            super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar15 == psVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"warning: no \'camera\'(s) in pbrt file",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else {
    do {
      peVar13 = (psVar15->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      this = (psVar15->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (peVar13 == (element_type *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"invalid pbrt camera");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_c8.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar13;
      local_c8.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = this;
      local_b8 = findCameraFov(&local_c8);
      if (local_c8.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      fVar18 = (peVar13->transform).atStart.l.vy.y;
      fVar19 = (peVar13->transform).atStart.l.vy.z;
      fVar1 = (peVar13->transform).atStart.l.vy.x;
      fVar2 = (peVar13->transform).atStart.l.vx.z;
      fVar3 = (peVar13->transform).atStart.l.vx.x;
      fVar4 = (peVar13->transform).atStart.l.vx.y;
      uVar6 = (peVar13->transform).atStart.l.vz.x;
      uVar9 = (peVar13->transform).atStart.l.vz.y;
      fVar20 = (peVar13->transform).atStart.l.vz.z;
      local_88 = fVar19 * (float)uVar6 - fVar20 * fVar1;
      uVar8 = *(undefined8 *)&(peVar13->transform).atStart.l.vy.z;
      local_58 = fVar18 * fVar20 - (float)uVar9 * (float)uVar8;
      fVar16 = fVar1 * (float)uVar9 - (float)uVar6 * fVar18;
      fVar5 = (peVar13->transform).atStart.p.z;
      fVar17 = 1.0 / (fVar2 * fVar16 + fVar3 * local_58 + fVar4 * local_88);
      local_88 = local_88 * fVar17;
      fStack_54 = (fVar2 * (float)uVar9 - fVar4 * fVar20) * fVar17;
      fStack_80 = fVar17 * 0.0;
      fStack_7c = fVar17 * 0.0;
      local_58 = local_58 * fVar17;
      fStack_84 = (fVar3 * fVar20 - fVar2 * (float)((ulong)uVar8 >> 0x20)) * fVar17;
      fStack_50 = (fVar20 * 0.0 - 0.0) * fVar17;
      fStack_4c = (fVar20 * 0.0 - 0.0) * fVar17;
      fVar16 = fVar17 * fVar16;
      fStack_b4 = fVar17 * (fVar4 * (float)uVar6 - fVar3 * (float)uVar9);
      fStack_b0 = fVar17 * 0.0;
      fStack_ac = fVar17 * 0.0;
      fVar20 = (fVar4 * fVar19 - fVar18 * fVar2) * fVar17;
      fVar19 = (fVar2 * fVar1 - fVar19 * fVar3) * fVar17;
      fVar17 = fVar17 * (fVar3 * fVar18 - fVar1 * fVar4);
      local_48 = ZEXT416((uint)fVar17);
      uVar7 = (peVar13->transform).atStart.p.x;
      uVar10 = (peVar13->transform).atStart.p.y;
      local_98 = ZEXT416((uint)fVar20);
      local_a8 = ZEXT416((uint)fVar19);
      local_78 = fVar5 * fVar16 + (float)uVar7 * local_58 + (float)uVar10 * local_88;
      fStack_74 = fVar5 * fStack_b4 + (float)uVar10 * fStack_84 + (float)uVar7 * fStack_54;
      fStack_70 = fVar5 * fStack_b0 + fStack_50 * 0.0 + fStack_80 * 0.0;
      fStack_6c = fVar5 * fStack_ac + fStack_4c * 0.0 + fStack_7c * 0.0;
      fVar18 = fVar5 * fVar17 + (float)uVar10 * fVar19 + (float)uVar7 * fVar20;
      local_68 = ZEXT416((uint)fVar18);
      uVar14 = CONCAT44(fStack_74,local_78) ^ 0x8000000080000000;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.x = (float)(int)uVar14;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.y = (float)(int)(uVar14 >> 0x20);
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.z = -fVar18;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.x = local_58 * 0.0;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.y = fStack_54 * 0.0;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.z = fVar20 * 0.0;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.x = local_88 * 0.0;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.y = fStack_84 * 0.0;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.z = fVar19 * 0.0;
      fVar18 = local_b8 * 0.5;
      local_b8 = fVar16;
      fVar18 = tanf(fVar18 * 0.017453292);
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.x = local_b8 - local_78;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.y = fStack_b4 - fStack_74;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.z = (float)local_48._0_4_ - (float)local_68._0_4_;
      fVar19 = -1.0 / (0.5 / fVar18);
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.x = fVar19 * local_58;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.y = fVar19 * fStack_54;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.z = (float)local_98._0_4_ * fVar19;
      fVar18 = 1.0 / (0.5 / fVar18);
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.x = fVar18 * local_88;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.y = fVar18 * fStack_84;
      ((local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.z = (float)local_a8._0_4_ * fVar18;
      std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
      push_back(&((scene->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 cameras,&local_d8);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar12);
  }
  if (local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void createCamera(Scene::SP scene, pbrt::syntactic::Scene::SP pbrt)
  {
    Camera::SP ours = std::make_shared<Camera>();
    if (pbrt->cameras.empty()) {
      std::cout << "warning: no 'camera'(s) in pbrt file" << std::endl;
      return;
    }

    for (auto camera : pbrt->cameras) {
      if (!camera)
        throw std::runtime_error("invalid pbrt camera");

      const float fov = findCameraFov(camera);

      // TODO: lensradius and focaldistance:

      //     float 	lensradius 	0 	The radius of the lens. Used to render scenes with depth of field and focus effects. The default value yields a pinhole camera.
      const float lensRadius = 0.f;

      // float 	focaldistance 	10^30 	The focal distance of the lens. If "lensradius" is zero, this has no effect. Otherwise, it specifies the distance from the camera origin to the focal plane.
      const float focalDistance = 1.f;
    
      const affine3f frame = inverse(camera->transform.atStart);
    
      ours->simplified.lens_center = frame.p;
      ours->simplified.lens_du = lensRadius * frame.l.vx;
      ours->simplified.lens_dv = lensRadius * frame.l.vy;

      const float fovDistanceToUnitPlane = 0.5f / tanf(fov/2 * float(M_PI/180.f));
      ours->simplified.screen_center = frame.p + focalDistance * frame.l.vz;
      ours->simplified.screen_du = - focalDistance/fovDistanceToUnitPlane * frame.l.vx;
      ours->simplified.screen_dv = focalDistance/fovDistanceToUnitPlane * frame.l.vy;

      scene->cameras.push_back(ours);
    }
  }